

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O2

void * metacallt(char *name,metacall_value_id *ids,...)

{
  char in_AL;
  type_id tVar1;
  metacall_value_id id;
  loader_data v;
  function func;
  signature s;
  size_t size;
  type t;
  short *psVar2;
  uchar *puVar3;
  char *pcVar4;
  value pvVar5;
  double *pdVar6;
  size_t length;
  int *piVar7;
  long *plVar8;
  undefined8 *puVar9;
  function_return pvVar10;
  undefined8 in_RCX;
  ulong uVar11;
  undefined8 in_RDX;
  size_t sVar12;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  double local_168 [4];
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  void *args [16];
  
  if (in_AL != '\0') {
    local_138 = in_XMM0_Qa;
    local_128 = in_XMM1_Qa;
    local_118 = in_XMM2_Qa;
    local_108 = in_XMM3_Qa;
    local_f8 = in_XMM4_Qa;
    local_e8 = in_XMM5_Qa;
    local_d8 = in_XMM6_Qa;
    local_c8 = in_XMM7_Qa;
  }
  local_168[2] = (double)in_RDX;
  local_168[3] = (double)in_RCX;
  local_148 = in_R8;
  local_140 = in_R9;
  v = loader_get(name);
  tVar1 = value_type_id(v);
  if ((tVar1 == 0xd) && (func = value_to_function(v), func != (function)0x0)) {
    s = function_signature(func);
    size = signature_count(s);
    va[0].overflow_arg_area = &stack0x00000008;
    va[0].gp_offset = 0x10;
    va[0].fp_offset = 0x30;
    for (sVar12 = 0; size != sVar12; sVar12 = sVar12 + 1) {
      t = signature_get_type(s,sVar12);
      type_index(t);
      if (t == (type)0x0) {
        id = ids[sVar12];
      }
      else {
        id = type_index(t);
      }
      switch(id) {
      case METACALL_BOOL:
        uVar11 = va[0]._0_8_ & 0xffffffff;
        if (uVar11 < 0x29) {
          va[0].gp_offset = va[0].gp_offset + 8;
          puVar3 = (uchar *)((long)local_168 + uVar11);
        }
        else {
          puVar3 = (uchar *)va[0].overflow_arg_area;
          va[0].overflow_arg_area = (void *)((long)va[0].overflow_arg_area + 8);
        }
        value_create_bool(*puVar3);
      default:
        pcVar4 = type_id_name(id);
        log_write_impl_va("metacall",0x2e6,"metacallt",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                          ,LOG_LEVEL_ERROR,
                          "Calling metacallt with unsupported type \'%s\', using null type instead",
                          pcVar4);
        pvVar5 = metacall_value_create_null();
        break;
      case METACALL_CHAR:
        uVar11 = va[0]._0_8_ & 0xffffffff;
        if (uVar11 < 0x29) {
          va[0].gp_offset = va[0].gp_offset + 8;
          pcVar4 = (char *)((long)local_168 + uVar11);
        }
        else {
          pcVar4 = (char *)va[0].overflow_arg_area;
          va[0].overflow_arg_area = (void *)((long)va[0].overflow_arg_area + 8);
        }
        pvVar5 = value_create_char(*pcVar4);
        break;
      case METACALL_SHORT:
        uVar11 = va[0]._0_8_ & 0xffffffff;
        if (uVar11 < 0x29) {
          va[0].gp_offset = va[0].gp_offset + 8;
          psVar2 = (short *)((long)local_168 + uVar11);
        }
        else {
          psVar2 = (short *)va[0].overflow_arg_area;
          va[0].overflow_arg_area = (void *)((long)va[0].overflow_arg_area + 8);
        }
        pvVar5 = value_create_short(*psVar2);
        break;
      case METACALL_INT:
        uVar11 = va[0]._0_8_ & 0xffffffff;
        if (uVar11 < 0x29) {
          va[0].gp_offset = va[0].gp_offset + 8;
          piVar7 = (int *)((long)local_168 + uVar11);
        }
        else {
          piVar7 = (int *)va[0].overflow_arg_area;
          va[0].overflow_arg_area = (void *)((long)va[0].overflow_arg_area + 8);
        }
        pvVar5 = value_create_int(*piVar7);
        break;
      case METACALL_LONG:
        uVar11 = va[0]._0_8_ & 0xffffffff;
        if (uVar11 < 0x29) {
          va[0].gp_offset = va[0].gp_offset + 8;
          plVar8 = (long *)((long)local_168 + uVar11);
        }
        else {
          plVar8 = (long *)va[0].overflow_arg_area;
          va[0].overflow_arg_area = (void *)((long)va[0].overflow_arg_area + 8);
        }
        pvVar5 = value_create_long(*plVar8);
        break;
      case METACALL_FLOAT:
        uVar11 = (ulong)va[0].fp_offset;
        if (uVar11 < 0xa1) {
          va[0].fp_offset = va[0].fp_offset + 0x10;
          pdVar6 = (double *)((long)local_168 + uVar11);
        }
        else {
          pdVar6 = (double *)va[0].overflow_arg_area;
          va[0].overflow_arg_area = (void *)((long)va[0].overflow_arg_area + 8);
        }
        pvVar5 = value_create_float((float)*pdVar6);
        break;
      case METACALL_DOUBLE:
        uVar11 = (ulong)va[0].fp_offset;
        if (uVar11 < 0xa1) {
          va[0].fp_offset = va[0].fp_offset + 0x10;
          pdVar6 = (double *)((long)local_168 + uVar11);
        }
        else {
          pdVar6 = (double *)va[0].overflow_arg_area;
          va[0].overflow_arg_area = (void *)((long)va[0].overflow_arg_area + 8);
        }
        pvVar5 = value_create_double(*pdVar6);
        break;
      case METACALL_STRING:
        uVar11 = va[0]._0_8_ & 0xffffffff;
        if (uVar11 < 0x29) {
          va[0].gp_offset = va[0].gp_offset + 8;
          puVar9 = (undefined8 *)((long)local_168 + uVar11);
        }
        else {
          puVar9 = (undefined8 *)va[0].overflow_arg_area;
          va[0].overflow_arg_area = (void *)((long)va[0].overflow_arg_area + 8);
        }
        pcVar4 = (char *)*puVar9;
        length = strlen(pcVar4);
        pvVar5 = value_create_string(pcVar4,length);
        break;
      case METACALL_PTR:
        uVar11 = va[0]._0_8_ & 0xffffffff;
        if (uVar11 < 0x29) {
          va[0].gp_offset = va[0].gp_offset + 8;
          puVar9 = (undefined8 *)((long)local_168 + uVar11);
        }
        else {
          puVar9 = (undefined8 *)va[0].overflow_arg_area;
          va[0].overflow_arg_area = (void *)((long)va[0].overflow_arg_area + 8);
        }
        pvVar5 = value_create_ptr((void *)*puVar9);
      }
      args[sVar12] = pvVar5;
    }
    pvVar10 = function_call(func,args,size);
    for (sVar12 = 0; size != sVar12; sVar12 = sVar12 + 1) {
      value_type_destroy(args[sVar12]);
    }
  }
  else {
    pvVar10 = (void *)0x0;
  }
  return pvVar10;
}

Assistant:

void *metacallt(const char *name, const enum metacall_value_id ids[], ...)
{
	value f_val = loader_get(name);
	function f = NULL;

	if (value_type_id(f_val) == TYPE_FUNCTION)
	{
		f = value_to_function(f_val);
	}

	if (f != NULL)
	{
		void *args[METACALL_ARGS_SIZE];

		value ret = NULL;

		signature s = function_signature(f);

		size_t iterator, args_count = signature_count(s);

		va_list va;

		va_start(va, ids);

		for (iterator = 0; iterator < args_count; ++iterator)
		{
			type t = signature_get_type(s, iterator);

			type_id id = type_index(t);

			if (t != NULL)
			{
				id = type_index(t);
			}
			else
			{
				id = ids[iterator];
			}

			if (id == TYPE_BOOL)
			{
				args[iterator] = value_create_bool((boolean)va_arg(va, unsigned int));
			}
			if (id == TYPE_CHAR)
			{
				args[iterator] = value_create_char((char)va_arg(va, int));
			}
			else if (id == TYPE_SHORT)
			{
				args[iterator] = value_create_short((short)va_arg(va, int));
			}
			else if (id == TYPE_INT)
			{
				args[iterator] = value_create_int(va_arg(va, int));
			}
			else if (id == TYPE_LONG)
			{
				args[iterator] = value_create_long(va_arg(va, long));
			}
			else if (id == TYPE_FLOAT)
			{
				args[iterator] = value_create_float((float)va_arg(va, double));
			}
			else if (id == TYPE_DOUBLE)
			{
				args[iterator] = value_create_double(va_arg(va, double));
			}
			else if (id == TYPE_STRING)
			{
				const char *str = va_arg(va, const char *);

				args[iterator] = value_create_string(str, strlen(str));
			}
			else if (id == TYPE_PTR)
			{
				args[iterator] = value_create_ptr(va_arg(va, const void *));
			}
			else
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Calling metacallt with unsupported type '%s', using null type instead", type_id_name(id));
				args[iterator] = metacall_value_create_null();
			}
		}

		va_end(va);

		ret = function_call(f, args, args_count);

		for (iterator = 0; iterator < args_count; ++iterator)
		{
			value_type_destroy(args[iterator]);
		}

		return ret;
	}

	return NULL;
}